

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
NEST::NESTcalc::SetDriftVelocity_NonUniform
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,NESTcalc *this,double rho
          ,double zStep,double kel,double bar,double dx,double dy)

{
  iterator __position;
  bool inGas;
  VDetector *pVVar1;
  undefined4 uVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Db;
  double temperature;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_68;
  double local_20;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar1 = this->fdetector;
  dVar6 = pVVar1->TopDrift;
  uVar2 = SUB84(dVar6,0);
  uVar3 = (undefined4)((ulong)dVar6 >> 0x20);
  temperature = 0.0;
  if (0.0 < dVar6) {
    dVar6 = bar;
    do {
      dVar4 = temperature;
      if ((double)CONCAT44(uVar3,uVar2) < temperature ||
          (double)CONCAT44(uVar3,uVar2) == temperature) {
        local_68 = 0.0;
      }
      else {
        local_68 = 0.0;
        do {
          if (temperature < pVVar1->gate || temperature == pVVar1->gate) {
            (*pVVar1->_vptr_VDetector[4])(SUB84(dx,0),dy);
            dVar5 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
            inGas = this->fdetector->inGas;
LAB_00110797:
            dVar6 = bar;
            dVar5 = GetDriftVelocity(kel,rho,dVar5,inGas,bar);
            uVar2 = SUB84(dVar5,0);
            uVar3 = (undefined4)((ulong)dVar5 >> 0x20);
          }
          else {
            if (pVVar1->inGas == false) {
              dVar5 = (pVVar1->E_gas / 1.8476719333639615) * 1000.0;
              inGas = false;
              goto LAB_00110797;
            }
            dVar5 = GetDriftVelocity_MagBoltz(temperature,rho,pVVar1->E_gas * 1000.0,dVar6,131.293);
            uVar2 = SUB84(dVar5,0);
            uVar3 = (undefined4)((ulong)dVar5 >> 0x20);
          }
          local_68 = local_68 + zStep / (double)CONCAT44(uVar3,uVar2);
          dVar4 = dVar4 + zStep;
          pVVar1 = this->fdetector;
        } while (dVar4 < pVVar1->TopDrift);
      }
      local_20 = (dVar4 - temperature) / local_68;
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,__position,&local_20);
        pVVar1 = this->fdetector;
      }
      else {
        *__position._M_current = local_20;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      temperature = temperature + zStep;
      dVar4 = pVVar1->TopDrift;
      uVar2 = SUB84(dVar4,0);
      uVar3 = (undefined4)((ulong)dVar4 >> 0x20);
    } while (temperature < dVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> NESTcalc::SetDriftVelocity_NonUniform(double rho, double zStep, double kel, double bar,
                                                     double dx, double dy) {
  vector<double> speedTable;
  double driftTime, zz;

  for (double pos_z = 0.0; pos_z < fdetector->get_TopDrift(); pos_z += zStep) {
    driftTime = 0.0;
    for (zz = pos_z; zz < fdetector->get_TopDrift(); zz += zStep) {
      if (pos_z > fdetector->get_gate()) {
        if (!fdetector->get_inGas())
          driftTime +=
              zStep / SetDriftVelocity(kel, rho,
                                       fdetector->get_E_gas() /
				       (EPS_LIQ / std::abs(EPS_GAS)) * 1e3, bar);
        else {
          // if gate == TopDrift properly set, shouldn't happen
          driftTime += zStep / GetDriftVelocity_MagBoltz(kel,
					   rho, fdetector->get_E_gas() * 1e3, bar);
        }
      } else {
        driftTime +=
            zStep /
            SetDriftVelocity(
                kel, rho,
                fdetector->FitEF(dx, dy,
                                 zz), bar);  // update x and y if you want 3-D fields
      }
    }

    speedTable.emplace_back((zz - pos_z) / driftTime);  // uses highest zz
  }

  return speedTable;
}